

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

size_t http_time2str(char *target,time_t t)

{
  size_t sVar1;
  long *in_FS_OFFSET;
  timespec tVar2;
  undefined1 local_a8 [8];
  tm_conflict tm_1;
  tm_conflict tm;
  time_t last_tick;
  time_t t_local;
  char *target_local;
  
  tVar2 = fio_last_tick();
  tm.tm_zone = (char *)tVar2.tv_sec;
  if ((long)(t | 7U) < (long)tm.tm_zone) {
    http_gmtime(t,(tm_conflict *)&tm_1.tm_zone);
    target_local = (char *)http_date2str(target,(tm_conflict *)&tm_1.tm_zone);
  }
  else {
    if (*(long *)(*in_FS_OFFSET + -0x60) < (long)tm.tm_zone) {
      *(char **)(*in_FS_OFFSET + -0x60) = tm.tm_zone;
      http_gmtime((time_t)tm.tm_zone,(tm_conflict *)local_a8);
      sVar1 = http_date2str((char *)(*in_FS_OFFSET + -0x50),(tm_conflict *)local_a8);
      *(size_t *)(*in_FS_OFFSET + -0x20) = sVar1;
    }
    memcpy(target,(void *)(*in_FS_OFFSET + -0x50),*(size_t *)(*in_FS_OFFSET + -0x20));
    target_local = *(char **)(*in_FS_OFFSET + -0x20);
  }
  return (size_t)target_local;
}

Assistant:

size_t http_time2str(char *target, const time_t t) {
  /* pre-print time every 1 or 2 seconds or so. */
  static __thread time_t cached_tick;
  static __thread char cached_httpdate[48];
  static __thread size_t cached_len;
  time_t last_tick = fio_last_tick().tv_sec;
  if ((t | 7) < last_tick) {
    /* this is a custom time, not "now", pass through */
    struct tm tm;
    http_gmtime(t, &tm);
    return http_date2str(target, &tm);
  }
  if (last_tick > cached_tick) {
    struct tm tm;
    cached_tick = last_tick; /* refresh every second */
    http_gmtime(last_tick, &tm);
    cached_len = http_date2str(cached_httpdate, &tm);
  }
  memcpy(target, cached_httpdate, cached_len);
  return cached_len;
}